

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Entry.h
# Opt level: O0

void __thiscall Nova::Log::Log_Entry::~Log_Entry(Log_Entry *this)

{
  Log_Entry *this_local;
  
  ~Log_Entry(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Log_Entry() {}